

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polygon.cc
# Opt level: O1

void gimage::extractContour(Polygon *p,ImageU8 *mask,ImageU8 *image,long sx,long sy,int dir)

{
  uchar uVar1;
  pointer pSVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  SVector<long,_2> local_40;
  
  pSVar2 = (p->vertex).
           super__Vector_base<gmath::SVector<long,_2>,_std::allocator<gmath::SVector<long,_2>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((p->vertex).
      super__Vector_base<gmath::SVector<long,_2>,_std::allocator<gmath::SVector<long,_2>_>_>._M_impl
      .super__Vector_impl_data._M_finish != pSVar2) {
    (p->vertex).
    super__Vector_base<gmath::SVector<long,_2>,_std::allocator<gmath::SVector<long,_2>_>_>._M_impl.
    super__Vector_impl_data._M_finish = pSVar2;
  }
  local_40.v[0] = sx;
  local_40.v[1] = sy;
  std::vector<gmath::SVector<long,2>,std::allocator<gmath::SVector<long,2>>>::
  emplace_back<gmath::SVector<long,2>>
            ((vector<gmath::SVector<long,2>,std::allocator<gmath::SVector<long,2>>> *)p,&local_40);
  lVar7 = sy;
  lVar9 = sx;
  do {
    uVar1 = (*image->img)[lVar7][lVar9];
    (*mask->img)[lVar7][lVar9] = 0xff;
    uVar5 = dir + 8;
    if (-1 < (int)(dir + 1U)) {
      uVar5 = dir + 1U;
    }
    iVar4 = (dir - (uVar5 & 0xfffffff8)) + 1;
    bVar3 = false;
    do {
      if ((iVar4 == dir) || (bVar3)) break;
      lVar6 = *(long *)((anonymous_namespace)::
                        nextContourPixel(long&,long&,int&,gimage::Image<unsigned_char,gimage::PixelTraits<unsigned_char>>&,gimage::Image<unsigned_char,gimage::PixelTraits<unsigned_char>>const&,long,long)
                        ::dx + (long)iVar4 * 8) + lVar9;
      lVar8 = *(long *)((anonymous_namespace)::
                        nextContourPixel(long&,long&,int&,gimage::Image<unsigned_char,gimage::PixelTraits<unsigned_char>>&,gimage::Image<unsigned_char,gimage::PixelTraits<unsigned_char>>const&,long,long)
                        ::dy + (long)iVar4 * 8) + lVar7;
      if (lVar8 != sy || lVar6 != sx) {
        if ((((-1 < lVar6) && (-1 < lVar8)) && (lVar6 < image->width)) &&
           (((lVar8 < image->height && ((*image->img)[lVar8][lVar6] == uVar1)) &&
            ((*mask->img)[lVar8][lVar6] == '\0')))) {
          uVar5 = iVar4 + 0xb;
          if (-1 < (int)(iVar4 + 4U)) {
            uVar5 = iVar4 + 4U;
          }
          dir = (iVar4 - (uVar5 & 0xfffffff8)) + 4;
          bVar3 = true;
          lVar7 = lVar8;
          lVar9 = lVar6;
        }
        uVar5 = iVar4 + 8;
        if (-1 < (int)(iVar4 + 1U)) {
          uVar5 = iVar4 + 1U;
        }
        iVar4 = (iVar4 - (uVar5 & 0xfffffff8)) + 1;
      }
    } while (lVar8 != sy || lVar6 != sx);
    if (!bVar3) {
      return;
    }
    local_40.v[0] = lVar9;
    local_40.v[1] = lVar7;
    std::vector<gmath::SVector<long,2>,std::allocator<gmath::SVector<long,2>>>::
    emplace_back<gmath::SVector<long,2>>
              ((vector<gmath::SVector<long,2>,std::allocator<gmath::SVector<long,2>>> *)p,&local_40)
    ;
  } while( true );
}

Assistant:

void extractContour(Polygon &p, ImageU8 &mask, const ImageU8 &image, long sx, long sy, int dir)
{
  long x=sx;
  long y=sy;

  p.clear();
  p.add(x, y);

  while (nextContourPixel(x, y, dir, mask, image, sx, sy))
  {
    p.add(x, y);
  }
}